

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

void lys_submodule_free(lys_submodule *submodule,
                       _func_void_lys_node_ptr_void_ptr *private_destructor)

{
  int local_1c;
  int i;
  _func_void_lys_node_ptr_void_ptr *private_destructor_local;
  lys_submodule *submodule_local;
  
  if (submodule != (lys_submodule *)0x0) {
    module_free_common((lys_module *)submodule,private_destructor);
    for (local_1c = 0; local_1c < (int)(uint)submodule->inc_size; local_1c = local_1c + 1) {
      lydict_remove(submodule->ctx,submodule->inc[local_1c].dsc);
      lydict_remove(submodule->ctx,submodule->inc[local_1c].ref);
      lys_extension_instances_free
                (submodule->ctx,submodule->inc[local_1c].ext,(uint)submodule->inc[local_1c].ext_size
                 ,private_destructor);
    }
    free(submodule->inc);
    free(submodule);
  }
  return;
}

Assistant:

void
lys_submodule_free(struct lys_submodule *submodule, void (*private_destructor)(const struct lys_node *node, void *priv))
{
    int i;

    if (!submodule) {
        return;
    }

    /* common part with struct ly_module */
    module_free_common((struct lys_module *)submodule, private_destructor);

    /* include */
    for (i = 0; i < submodule->inc_size; i++) {
        lydict_remove(submodule->ctx, submodule->inc[i].dsc);
        lydict_remove(submodule->ctx, submodule->inc[i].ref);
        lys_extension_instances_free(submodule->ctx, submodule->inc[i].ext, submodule->inc[i].ext_size, private_destructor);
        /* complete submodule free is done only from main module since
         * submodules propagate their includes to the main module */
    }
    free(submodule->inc);

    free(submodule);
}